

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O1

bool duckdb::Varint::VarcharFormatting
               (string_t *value,idx_t *start_pos,idx_t *end_pos,bool *is_negative,bool *is_zero)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  if ((value->value).pointer.length == 0) {
    return false;
  }
  *start_pos = 0;
  *is_zero = false;
  uVar6 = (ulong)(value->value).pointer.length;
  if (uVar6 < 0xd) {
    pcVar4 = (value->value).pointer.prefix;
  }
  else {
    pcVar4 = (value->value).pointer.ptr;
  }
  *end_pos = uVar6;
  cVar1 = *pcVar4;
  *is_negative = cVar1 == '-';
  if (cVar1 == '-') {
    *start_pos = *start_pos + 1;
  }
  if (*pcVar4 == '+') {
    *start_pos = *start_pos + 1;
  }
  uVar6 = *start_pos;
  uVar5 = *end_pos;
  if (uVar6 < uVar5) {
    bVar7 = pcVar4[uVar6] == '0';
    bVar8 = bVar7;
    while (bVar8) {
      uVar6 = uVar6 + 1;
      *start_pos = uVar6;
      uVar5 = *end_pos;
      if (uVar5 <= uVar6) break;
      bVar8 = pcVar4[uVar6] == '0';
    }
  }
  else {
    bVar7 = false;
  }
  bVar8 = uVar6 < uVar5;
  if (uVar6 == uVar5) {
    if (!bVar7) {
      return false;
    }
    *is_zero = true;
LAB_0132897f:
    bVar7 = true;
  }
  else {
    bVar7 = true;
    if (bVar8) {
      if ((int)pcVar4[uVar6] - 0x30U < 10) {
        do {
          if (uVar5 - 1 == uVar6) {
            return true;
          }
          lVar2 = uVar6 + 1;
          uVar6 = uVar6 + 1;
        } while ((int)pcVar4[lVar2] - 0x30U < 10);
        bVar8 = uVar6 < uVar5;
      }
      bVar7 = true;
      if (bVar8) {
        if (pcVar4[uVar6] != '.') {
          return false;
        }
        bVar7 = false;
        uVar3 = uVar6;
        do {
          uVar3 = uVar3 + 1;
          if (uVar5 <= uVar3) {
            *end_pos = uVar6;
            goto LAB_0132897f;
          }
        } while ((int)pcVar4[uVar3] - 0x30U < 10);
      }
    }
  }
  return bVar7;
}

Assistant:

bool Empty() const {
		return value.inlined.length == 0;
	}